

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.h
# Opt level: O0

int destroy_rw_lock(fdb_rw_lock *lock)

{
  int iVar1;
  pthread_rwlock_t *in_RDI;
  int rv;
  
  iVar1 = pthread_rwlock_destroy(in_RDI);
  return iVar1;
}

Assistant:

INLINE int destroy_rw_lock(fdb_rw_lock *lock) {
#if !defined(WIN32) && !defined(_WIN32)
    int rv = pthread_rwlock_destroy(lock);
    return rv;
#else
    // Nothing to do on Windows
    (void)lock;
    return 0;
#endif
}